

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

CFG * __thiscall CFG::toDOT_abi_cxx11_(CFG *this)

{
  CfgEdge *this_00;
  bool bVar1;
  int iVar2;
  Type TVar3;
  ostream *poVar4;
  reference ppCVar5;
  BlockData *this_01;
  void *pvVar6;
  list<Instruction_*,_std::allocator<Instruction_*>_> *__x;
  size_type sVar7;
  reference ppIVar8;
  reference ppCVar9;
  reference ppCVar10;
  Data *pDVar11;
  reference ppCVar12;
  CfgNode *pCVar13;
  Addr AVar14;
  CfgNode *this_02;
  unsigned_long_long uVar15;
  CFG *in_RSI;
  CfgNode *dst;
  CfgNode *src;
  CfgEdge *edge;
  iterator __end1_1;
  iterator __begin1_1;
  set<CfgEdge_*,_std::less<CfgEdge_*>,_std::allocator<CfgEdge_*>_> *__range1_1;
  PhantomData *phantomData;
  string local_348 [32];
  int local_328;
  char local_321;
  unsigned_long_long local_320;
  unsigned_long_long count_1;
  CFG *handler;
  iterator iStack_308;
  int sigid;
  const_iterator ed_2;
  const_iterator it_2;
  set<CfgSignalHandler_*,_std::less<CfgSignalHandler_*>,_std::allocator<CfgSignalHandler_*>_>
  *signalHandlers;
  string local_2b8 [32];
  unsigned_long_long local_298;
  unsigned_long_long count;
  CFG *called;
  const_iterator ed_1;
  const_iterator it_1;
  set<CfgCall_*,_std::less<CfgCall_*>,_std::allocator<CfgCall_*>_> *calls;
  string local_238 [32];
  Instruction *local_218;
  Instruction *instr;
  const_iterator ed;
  const_iterator it;
  list<Instruction_*,_std::allocator<Instruction_*>_> instrs;
  Addr addr;
  BlockData *blockData;
  CfgNode *node;
  iterator __end1;
  iterator __begin1;
  set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> *__range1;
  int local_1a4;
  stringstream local_1a0 [4];
  int unknown;
  stringstream ss;
  ostream local_190 [384];
  CFG *this_local;
  
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1a4 = 1;
  std::ostream::operator<<(local_190,std::hex);
  poVar4 = std::operator<<(local_190,"digraph \"0x");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RSI->m_addr);
  poVar4 = std::operator<<(poVar4,"\" {");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(local_190,"  label = \"0x");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RSI->m_addr);
  poVar4 = std::operator<<(poVar4," (");
  poVar4 = std::operator<<(poVar4,(string *)&in_RSI->m_functionName);
  poVar4 = std::operator<<(poVar4,")\"");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(local_190,"  labelloc = \"t\"");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<(local_190,"  node[shape=record]");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(local_190,std::endl<char,std::char_traits<char>>);
  __end1 = std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::begin
                     (&in_RSI->m_nodes);
  node = (CfgNode *)
         std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>::end
                   (&in_RSI->m_nodes);
  do {
    bVar1 = std::operator!=(&__end1,(_Self *)&node);
    if (!bVar1) {
      __end1_1 = std::set<CfgEdge_*,_std::less<CfgEdge_*>,_std::allocator<CfgEdge_*>_>::begin
                           (&in_RSI->m_edges);
      edge = (CfgEdge *)
             std::set<CfgEdge_*,_std::less<CfgEdge_*>,_std::allocator<CfgEdge_*>_>::end
                       (&in_RSI->m_edges);
      do {
        bVar1 = std::operator!=(&__end1_1,(_Self *)&edge);
        if (!bVar1) {
          poVar4 = std::operator<<(local_190,"}");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::__cxx11::stringstream::str();
          std::__cxx11::stringstream::~stringstream(local_1a0);
          return this;
        }
        ppCVar12 = std::_Rb_tree_const_iterator<CfgEdge_*>::operator*(&__end1_1);
        this_00 = *ppCVar12;
        std::ostream::operator<<(local_190,std::hex);
        pCVar13 = CfgEdge::source(this_00);
        TVar3 = CfgNode::type(pCVar13);
        if (TVar3 == CFG_ENTRY) {
          std::operator<<(local_190,"  Entry -> ");
        }
        else {
          if (1 < TVar3 - CFG_BLOCK) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                          ,0x17e,"std::string CFG::toDOT() const");
          }
          poVar4 = std::operator<<(local_190,"  \"0x");
          AVar14 = CfgNode::node2addr(pCVar13);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,AVar14);
          std::operator<<(poVar4,"\" -> ");
        }
        this_02 = CfgEdge::destination(this_00);
        TVar3 = CfgNode::type(this_02);
        switch(TVar3) {
        case CFG_ENTRY:
        default:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                        ,399,"std::string CFG::toDOT() const");
        case CFG_BLOCK:
        case CFG_PHANTOM:
          poVar4 = std::operator<<(local_190,"\"0x");
          AVar14 = CfgNode::node2addr(this_02);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,AVar14);
          std::operator<<(poVar4,"\"");
          break;
        case CFG_EXIT:
          std::operator<<(local_190,"Exit");
          break;
        case CFG_HALT:
          std::operator<<(local_190,"Halt");
        }
        TVar3 = CfgNode::type(pCVar13);
        if (TVar3 == CFG_ENTRY) {
          poVar4 = (ostream *)std::ostream::operator<<(local_190,std::dec);
          poVar4 = std::operator<<(poVar4," [label=\" ");
          uVar15 = execs(in_RSI);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar15);
          std::operator<<(poVar4,"\"]");
        }
        else {
          poVar4 = (ostream *)std::ostream::operator<<(local_190,std::dec);
          poVar4 = std::operator<<(poVar4," [label=\" ");
          uVar15 = CfgEdge::count(this_00);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar15);
          std::operator<<(poVar4,"\"]");
        }
        std::ostream::operator<<(local_190,std::endl<char,std::char_traits<char>>);
        std::_Rb_tree_const_iterator<CfgEdge_*>::operator++(&__end1_1);
      } while( true );
    }
    ppCVar5 = std::_Rb_tree_const_iterator<CfgNode_*>::operator*(&__end1);
    pCVar13 = *ppCVar5;
    TVar3 = CfgNode::type(pCVar13);
    switch(TVar3) {
    case CFG_ENTRY:
      poVar4 = std::operator<<(local_190,
                               "  Entry [label=\"\",width=0.3,height=0.3,shape=circle,fillcolor=black,style=filled]"
                              );
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      break;
    case CFG_BLOCK:
      pDVar11 = CfgNode::data(pCVar13);
      if (pDVar11 == (Data *)0x0) {
        __assert_fail("node->data() != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                      ,0x120,"std::string CFG::toDOT() const");
      }
      this_01 = (BlockData *)CfgNode::data(pCVar13);
      AVar14 = CfgNode::Data::addr((Data *)this_01);
      poVar4 = std::operator<<(local_190,"  \"0x");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,AVar14);
      poVar4 = std::operator<<(poVar4,"\" [label=\"{");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<(local_190,"    0x");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,AVar14);
      poVar4 = std::operator<<(poVar4," [");
      pvVar6 = (void *)std::ostream::operator<<(poVar4,std::dec);
      iVar2 = CfgNode::BlockData::size(this_01);
      poVar4 = (ostream *)std::ostream::operator<<(pvVar6,iVar2);
      poVar4 = std::operator<<(poVar4,"]\\l");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      __x = CfgNode::BlockData::instructions_abi_cxx11_(this_01);
      std::__cxx11::list<Instruction_*,_std::allocator<Instruction_*>_>::list
                ((list<Instruction_*,_std::allocator<Instruction_*>_> *)&it,__x);
      sVar7 = std::__cxx11::list<Instruction_*,_std::allocator<Instruction_*>_>::size
                        ((list<Instruction_*,_std::allocator<Instruction_*>_> *)&it);
      if (sVar7 != 0) {
        poVar4 = std::operator<<(local_190,"    | [instrs]\\l");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        ed = std::__cxx11::list<Instruction_*,_std::allocator<Instruction_*>_>::cbegin
                       ((list<Instruction_*,_std::allocator<Instruction_*>_> *)&it);
        instr = (Instruction *)
                std::__cxx11::list<Instruction_*,_std::allocator<Instruction_*>_>::cend
                          ((list<Instruction_*,_std::allocator<Instruction_*>_> *)&it);
        while (bVar1 = std::operator!=(&ed,(_Self *)&instr), bVar1) {
          ppIVar8 = std::_List_const_iterator<Instruction_*>::operator*(&ed);
          local_218 = *ppIVar8;
          poVar4 = std::operator<<(local_190,"    &nbsp;&nbsp;0x");
          pvVar6 = (void *)std::ostream::operator<<(poVar4,std::hex);
          AVar14 = Instruction::addr(local_218);
          poVar4 = (ostream *)std::ostream::operator<<(pvVar6,AVar14);
          poVar4 = std::operator<<(poVar4," \\<+");
          pvVar6 = (void *)std::ostream::operator<<(poVar4,std::dec);
          iVar2 = Instruction::size(local_218);
          poVar4 = (ostream *)std::ostream::operator<<(pvVar6,iVar2);
          poVar4 = std::operator<<(poVar4,"\\>: ");
          Instruction::text_abi_cxx11_(local_218);
          dotFilter(local_238);
          poVar4 = std::operator<<(poVar4,(string *)local_238);
          poVar4 = std::operator<<(poVar4,"\\l");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)local_238);
          std::_List_const_iterator<Instruction_*>::operator++(&ed,0);
        }
      }
      CfgNode::BlockData::calls
                ((set<CfgCall_*,_std::less<CfgCall_*>,_std::allocator<CfgCall_*>_> *)&it_1,this_01);
      bVar1 = std::set<CfgCall_*,_std::less<CfgCall_*>,_std::allocator<CfgCall_*>_>::empty
                        ((set<CfgCall_*,_std::less<CfgCall_*>,_std::allocator<CfgCall_*>_> *)&it_1);
      if (!bVar1) {
        poVar4 = std::operator<<(local_190,"    | [calls]\\l");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        ed_1._M_node = (_Base_ptr)
                       std::set<CfgCall_*,_std::less<CfgCall_*>,_std::allocator<CfgCall_*>_>::cbegin
                                 ((set<CfgCall_*,_std::less<CfgCall_*>,_std::allocator<CfgCall_*>_>
                                   *)&it_1);
        called = (CFG *)std::set<CfgCall_*,_std::less<CfgCall_*>,_std::allocator<CfgCall_*>_>::cend
                                  ((set<CfgCall_*,_std::less<CfgCall_*>,_std::allocator<CfgCall_*>_>
                                    *)&it_1);
        while (bVar1 = std::operator!=(&ed_1,(_Self *)&called), bVar1) {
          ppCVar9 = std::_Rb_tree_const_iterator<CfgCall_*>::operator*(&ed_1);
          count = (unsigned_long_long)CfgCall::called(*ppCVar9);
          ppCVar9 = std::_Rb_tree_const_iterator<CfgCall_*>::operator*(&ed_1);
          local_298 = CfgCall::count(*ppCVar9);
          poVar4 = (ostream *)std::ostream::operator<<(local_190,std::hex);
          poVar4 = std::operator<<(poVar4,"    &nbsp;&nbsp;0x");
          AVar14 = CFG::addr((CFG *)count);
          std::ostream::operator<<(poVar4,AVar14);
          if (local_298 != 0) {
            poVar4 = (ostream *)std::ostream::operator<<(local_190,std::dec);
            poVar4 = std::operator<<(poVar4," \\{");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_298);
            std::operator<<(poVar4,"\\} ");
          }
          poVar4 = std::operator<<(local_190," (");
          functionName_abi_cxx11_((CFG *)count);
          dotFilter(local_2b8);
          poVar4 = std::operator<<(poVar4,(string *)local_2b8);
          poVar4 = std::operator<<(poVar4,")\\l");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)local_2b8);
          std::_Rb_tree_const_iterator<CfgCall_*>::operator++(&ed_1,0);
        }
      }
      CfgNode::BlockData::signalHandlers
                ((set<CfgSignalHandler_*,_std::less<CfgSignalHandler_*>,_std::allocator<CfgSignalHandler_*>_>
                  *)&it_2,this_01);
      bVar1 = std::
              set<CfgSignalHandler_*,_std::less<CfgSignalHandler_*>,_std::allocator<CfgSignalHandler_*>_>
              ::empty((set<CfgSignalHandler_*,_std::less<CfgSignalHandler_*>,_std::allocator<CfgSignalHandler_*>_>
                       *)&it_2);
      if (!bVar1) {
        poVar4 = std::operator<<(local_190,"    | [signals]\\l");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        ed_2._M_node = (_Base_ptr)
                       std::
                       set<CfgSignalHandler_*,_std::less<CfgSignalHandler_*>,_std::allocator<CfgSignalHandler_*>_>
                       ::cbegin((set<CfgSignalHandler_*,_std::less<CfgSignalHandler_*>,_std::allocator<CfgSignalHandler_*>_>
                                 *)&it_2);
        iStack_308 = std::
                     set<CfgSignalHandler_*,_std::less<CfgSignalHandler_*>,_std::allocator<CfgSignalHandler_*>_>
                     ::cend((set<CfgSignalHandler_*,_std::less<CfgSignalHandler_*>,_std::allocator<CfgSignalHandler_*>_>
                             *)&it_2);
        while (bVar1 = std::operator!=(&ed_2,&stack0xfffffffffffffcf8), bVar1) {
          ppCVar10 = std::_Rb_tree_const_iterator<CfgSignalHandler_*>::operator*(&ed_2);
          handler._4_4_ = CfgSignalHandler::sigid(*ppCVar10);
          ppCVar10 = std::_Rb_tree_const_iterator<CfgSignalHandler_*>::operator*(&ed_2);
          count_1 = (unsigned_long_long)CfgSignalHandler::handler(*ppCVar10);
          ppCVar10 = std::_Rb_tree_const_iterator<CfgSignalHandler_*>::operator*(&ed_2);
          local_320 = CfgSignalHandler::count(*ppCVar10);
          poVar4 = (ostream *)std::ostream::operator<<(local_190,std::dec);
          poVar4 = std::operator<<(poVar4,"    &nbsp;&nbsp;");
          local_321 = (char)std::setfill<char>('0');
          poVar4 = std::operator<<(poVar4,local_321);
          local_328 = (int)std::setw(2);
          poVar4 = std::operator<<(poVar4,(_Setw)local_328);
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,handler._4_4_);
          std::operator<<(poVar4,": ");
          poVar4 = (ostream *)std::ostream::operator<<(local_190,std::hex);
          poVar4 = std::operator<<(poVar4,"0x");
          AVar14 = CFG::addr((CFG *)count_1);
          std::ostream::operator<<(poVar4,AVar14);
          if (local_320 != 0) {
            poVar4 = (ostream *)std::ostream::operator<<(local_190,std::dec);
            poVar4 = std::operator<<(poVar4," \\{");
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_320);
            std::operator<<(poVar4,"\\} ");
          }
          poVar4 = std::operator<<(local_190," (");
          functionName_abi_cxx11_((CFG *)count_1);
          dotFilter(local_348);
          poVar4 = std::operator<<(poVar4,(string *)local_348);
          poVar4 = std::operator<<(poVar4,")\\l");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)local_348);
          std::_Rb_tree_const_iterator<CfgSignalHandler_*>::operator++(&ed_2,0);
        }
      }
      poVar4 = std::operator<<(local_190,"  }\"]");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      bVar1 = CfgNode::BlockData::indirect(this_01);
      if (bVar1) {
        poVar4 = std::operator<<(local_190,"  \"Unknown");
        pvVar6 = (void *)std::ostream::operator<<(poVar4,std::dec);
        poVar4 = (ostream *)std::ostream::operator<<(pvVar6,local_1a4);
        poVar4 = std::operator<<(poVar4,"\" [label=\"?\", shape=none]");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<(local_190,"  \"0x");
        pvVar6 = (void *)std::ostream::operator<<(poVar4,std::hex);
        AVar14 = CfgNode::Data::addr((Data *)this_01);
        poVar4 = (ostream *)std::ostream::operator<<(pvVar6,AVar14);
        poVar4 = std::operator<<(poVar4,"\" -> \"Unknown");
        pvVar6 = (void *)std::ostream::operator<<(poVar4,std::dec);
        poVar4 = (ostream *)std::ostream::operator<<(pvVar6,local_1a4);
        poVar4 = std::operator<<(poVar4,"\" [style=dashed]");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        local_1a4 = local_1a4 + 1;
      }
      std::ostream::operator<<(local_190,std::hex);
      std::
      set<CfgSignalHandler_*,_std::less<CfgSignalHandler_*>,_std::allocator<CfgSignalHandler_*>_>::
      ~set((set<CfgSignalHandler_*,_std::less<CfgSignalHandler_*>,_std::allocator<CfgSignalHandler_*>_>
            *)&it_2);
      std::set<CfgCall_*,_std::less<CfgCall_*>,_std::allocator<CfgCall_*>_>::~set
                ((set<CfgCall_*,_std::less<CfgCall_*>,_std::allocator<CfgCall_*>_> *)&it_1);
      std::__cxx11::list<Instruction_*,_std::allocator<Instruction_*>_>::~list
                ((list<Instruction_*,_std::allocator<Instruction_*>_> *)&it);
      break;
    case CFG_PHANTOM:
      pDVar11 = CfgNode::data(pCVar13);
      if (pDVar11 == (Data *)0x0) {
        __assert_fail("node->data() != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                      ,0x163,"std::string CFG::toDOT() const");
      }
      pDVar11 = CfgNode::data(pCVar13);
      poVar4 = std::operator<<(local_190,"  \"0x");
      AVar14 = CfgNode::Data::addr(pDVar11);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,AVar14);
      poVar4 = std::operator<<(poVar4,"\" [label=\"{");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<(local_190,"     0x");
      AVar14 = CfgNode::Data::addr(pDVar11);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,AVar14);
      poVar4 = std::operator<<(poVar4,"\\l");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<(local_190,"  }\", style=dashed]");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      break;
    case CFG_EXIT:
      poVar4 = std::operator<<(local_190,
                               "  Exit [label=\"\",width=0.3,height=0.3,shape=circle,fillcolor=black,style=filled,peripheries=2]"
                              );
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      break;
    case CFG_HALT:
      poVar4 = std::operator<<(local_190,
                               "  Halt [label=\"\",width=0.3,height=0.3,shape=square,fillcolor=black,style=filled,peripheries=2]"
                              );
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                    ,0x16d,"std::string CFG::toDOT() const");
    }
    std::_Rb_tree_const_iterator<CfgNode_*>::operator++(&__end1);
  } while( true );
}

Assistant:

std::string CFG::toDOT() const {
	std::stringstream ss;
	int unknown = 1;

	ss << std::hex;
	ss << "digraph \"0x" << m_addr << "\" {" << std::endl;
	ss << "  label = \"0x" << m_addr << " (" << m_functionName << ")\"" << std::endl;
    ss << "  labelloc = \"t\"" << std::endl;
    ss << "  node[shape=record]" << std::endl;
    ss << std::endl;

	for (CfgNode* node : m_nodes) {
		switch (node->type()) {
			case CfgNode::CFG_ENTRY:
			    ss << "  Entry [label=\"\",width=0.3,height=0.3,shape=circle,fillcolor=black,style=filled]" << std::endl;
			    break;
			case CfgNode::CFG_EXIT:
				ss << "  Exit [label=\"\",width=0.3,height=0.3,shape=circle,fillcolor=black,style=filled,peripheries=2]" << std::endl;
			    break;
			case CfgNode::CFG_HALT:
				ss << "  Halt [label=\"\",width=0.3,height=0.3,shape=square,fillcolor=black,style=filled,peripheries=2]" << std::endl;
			    break;
			case CfgNode::CFG_BLOCK: {
				assert(node->data() != 0);
				CfgNode::BlockData* blockData = static_cast<CfgNode::BlockData*>(node->data());

				Addr addr =  blockData->addr();
				ss << "  \"0x" << addr << "\" [label=\"{" << std::endl;
				ss << "    0x" << addr << " [" << std::dec << blockData->size() << "]\\l" << std::endl;

				std::list<Instruction*> instrs = blockData->instructions();
				if (instrs.size() > 0) {
					ss << "    | [instrs]\\l" << std::endl;
					for (std::list<Instruction*>::const_iterator it = instrs.cbegin(), ed = instrs.cend();
							it != ed; it++) {
						Instruction* instr = *it;
						ss << "    &nbsp;&nbsp;0x" << std::hex << instr->addr() << " \\<+"
								<< std::dec << instr->size() << "\\>: " << dotFilter(instr->text())
								<< "\\l" << std::endl;
					}
				}

				const std::set<CfgCall*>& calls = blockData->calls();
				if (!calls.empty()) {
					ss << "    | [calls]\\l" << std::endl;
					for (std::set<CfgCall*>::const_iterator it = calls.cbegin(), ed = calls.cend();
							it != ed; it++) {
						CFG* called = (*it)->called();
						unsigned long long count = (*it)->count();

						ss << std::hex << "    &nbsp;&nbsp;0x" << called->addr();
						if (count > 0)
							ss << std::dec << " \\{" << count << "\\} ";

						ss << " ("
							<< dotFilter(called->functionName()) << ")\\l" << std::endl;
					}
				}

				const std::set<CfgSignalHandler*>& signalHandlers = blockData->signalHandlers();
				if (!signalHandlers.empty()) {
					ss << "    | [signals]\\l" << std::endl;
					for (std::set<CfgSignalHandler*>::const_iterator it = signalHandlers.cbegin(),
							ed = signalHandlers.cend(); it != ed; it++) {
						int sigid = (*it)->sigid();
						CFG* handler = (*it)->handler();
						unsigned long long count = (*it)->count();

						ss << std::dec << "    &nbsp;&nbsp;" << std::setfill('0') << std::setw(2) << sigid << ": ";
						ss << std::hex << "0x" << handler->addr();
						if (count > 0)
							ss << std::dec << " \\{" << count << "\\} ";

						ss << " ("
							<< dotFilter(handler->functionName()) << ")\\l" << std::endl;
					}
				}

				ss << "  }\"]" << std::endl;

                if (blockData->indirect()) {
					ss << "  \"Unknown" << std::dec << unknown << "\" [label=\"?\", shape=none]" << std::endl;
					ss << "  \"0x" << std::hex << blockData->addr() << "\" -> \"Unknown" << std::dec << unknown << "\" [style=dashed]" << std::endl;
                    unknown++;
                }

				ss << std::hex;
				break;
			}
			case CfgNode::CFG_PHANTOM: {
				assert(node->data() != 0);
				CfgNode::PhantomData* phantomData = static_cast<CfgNode::PhantomData*>(node->data());

				ss << "  \"0x" << phantomData->addr() << "\" [label=\"{" << std::endl;
				ss << "     0x" << phantomData->addr() << "\\l" << std::endl;
				ss << "  }\", style=dashed]" << std::endl;

				break;
			}
			default:
				assert(false);
		}
	}

	for (CfgEdge* edge : m_edges) {
		ss << std::hex;

		CfgNode* src = edge->source();
		switch (src->type()) {
			case CfgNode::CFG_ENTRY:
				ss << "  Entry -> ";
				break;
			case CfgNode::CFG_BLOCK:
			case CfgNode::CFG_PHANTOM:
				ss << "  \"0x" << CfgNode::node2addr(src) << "\" -> ";
				break;
			default:
				assert(false);
		}

		CfgNode* dst = edge->destination();
		switch (dst->type()) {
			case CfgNode::CFG_EXIT:
				ss << "Exit";
				break;
			case CfgNode::CFG_HALT:
				ss << "Halt";
				break;
			case CfgNode::CFG_BLOCK:
			case CfgNode::CFG_PHANTOM:
				ss << "\"0x" << CfgNode::node2addr(dst) << "\"";
				break;
			case CfgNode::CFG_ENTRY:
			default:
				assert(false);
		}

		if (src->type() == CfgNode::CFG_ENTRY)
			ss << std::dec << " [label=\" " << this->execs() << "\"]";
		else
			ss << std::dec << " [label=\" " << edge->count() << "\"]";

		ss << std::endl;
	}

	ss << "}" << std::endl;

	return ss.str();
}